

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

void update_default_encoder_config(cfg_options_t *cfg,av1_extracfg *extra_cfg)

{
  aom_superblock_size_t local_14;
  av1_extracfg *extra_cfg_local;
  cfg_options_t *cfg_local;
  
  extra_cfg->enable_cdef = (uint)(cfg->disable_cdef == 0);
  extra_cfg->enable_restoration = (uint)(cfg->disable_lr == 0);
  if (cfg->super_block_size == 0x40) {
    local_14 = AOM_SUPERBLOCK_SIZE_64X64;
  }
  else {
    local_14 = AOM_SUPERBLOCK_SIZE_DYNAMIC;
    if (cfg->super_block_size == 0x80) {
      local_14 = AOM_SUPERBLOCK_SIZE_128X128;
    }
  }
  extra_cfg->superblock_size = local_14;
  extra_cfg->enable_warped_motion = (uint)(cfg->disable_warp_motion == 0);
  extra_cfg->enable_dist_wtd_comp = (uint)(cfg->disable_dist_wtd_comp == 0);
  extra_cfg->enable_diff_wtd_comp = (uint)(cfg->disable_diff_wtd_comp == 0);
  extra_cfg->enable_dual_filter = (uint)(cfg->disable_dual_filter == 0);
  extra_cfg->enable_angle_delta = (uint)(cfg->disable_intra_angle_delta == 0);
  extra_cfg->enable_rect_partitions = (uint)(cfg->disable_rect_partition_type == 0);
  extra_cfg->enable_ab_partitions = (uint)(cfg->disable_ab_partition_type == 0);
  extra_cfg->enable_1to4_partitions = (uint)(cfg->disable_1to4_partition_type == 0);
  extra_cfg->max_partition_size = cfg->max_partition_size;
  extra_cfg->min_partition_size = cfg->min_partition_size;
  extra_cfg->enable_intra_edge_filter = (uint)(cfg->disable_intra_edge_filter == 0);
  extra_cfg->enable_tx64 = (uint)(cfg->disable_tx_64x64 == 0);
  extra_cfg->enable_flip_idtx = (uint)(cfg->disable_flip_idtx == 0);
  extra_cfg->enable_masked_comp = (uint)(cfg->disable_masked_comp == 0);
  extra_cfg->enable_interintra_comp = (uint)(cfg->disable_inter_intra_comp == 0);
  extra_cfg->enable_smooth_interintra = (uint)(cfg->disable_smooth_inter_intra == 0);
  extra_cfg->enable_interinter_wedge = (uint)(cfg->disable_inter_inter_wedge == 0);
  extra_cfg->enable_interintra_wedge = (uint)(cfg->disable_inter_intra_wedge == 0);
  extra_cfg->enable_global_motion = (uint)(cfg->disable_global_motion == 0);
  extra_cfg->enable_filter_intra = (uint)(cfg->disable_filter_intra == 0);
  extra_cfg->enable_smooth_intra = (uint)(cfg->disable_smooth_intra == 0);
  extra_cfg->enable_paeth_intra = (uint)(cfg->disable_paeth_intra == 0);
  extra_cfg->enable_cfl_intra = (uint)(cfg->disable_cfl == 0);
  extra_cfg->enable_obmc = (uint)(cfg->disable_obmc == 0);
  extra_cfg->enable_palette = (uint)(cfg->disable_palette == 0);
  extra_cfg->enable_intrabc = (uint)(cfg->disable_intrabc == 0);
  extra_cfg->disable_trellis_quant = cfg->disable_trellis_quant;
  extra_cfg->allow_ref_frame_mvs = (uint)(cfg->disable_ref_frame_mv == 0);
  extra_cfg->enable_ref_frame_mvs = (uint)(cfg->disable_ref_frame_mv == 0);
  extra_cfg->enable_onesided_comp = (uint)(cfg->disable_one_sided_comp == 0);
  extra_cfg->enable_reduced_reference_set = cfg->reduced_reference_set;
  extra_cfg->reduced_tx_type_set = cfg->reduced_tx_type_set;
  return;
}

Assistant:

static void update_default_encoder_config(const cfg_options_t *cfg,
                                          struct av1_extracfg *extra_cfg) {
  extra_cfg->enable_cdef = (cfg->disable_cdef == 0) ? 1 : 0;
  extra_cfg->enable_restoration = (cfg->disable_lr == 0);
  extra_cfg->superblock_size =
      (cfg->super_block_size == 64)    ? AOM_SUPERBLOCK_SIZE_64X64
      : (cfg->super_block_size == 128) ? AOM_SUPERBLOCK_SIZE_128X128
                                       : AOM_SUPERBLOCK_SIZE_DYNAMIC;
  extra_cfg->enable_warped_motion = (cfg->disable_warp_motion == 0);
  extra_cfg->enable_dist_wtd_comp = (cfg->disable_dist_wtd_comp == 0);
  extra_cfg->enable_diff_wtd_comp = (cfg->disable_diff_wtd_comp == 0);
  extra_cfg->enable_dual_filter = (cfg->disable_dual_filter == 0);
  extra_cfg->enable_angle_delta = (cfg->disable_intra_angle_delta == 0);
  extra_cfg->enable_rect_partitions = (cfg->disable_rect_partition_type == 0);
  extra_cfg->enable_ab_partitions = (cfg->disable_ab_partition_type == 0);
  extra_cfg->enable_1to4_partitions = (cfg->disable_1to4_partition_type == 0);
  extra_cfg->max_partition_size = cfg->max_partition_size;
  extra_cfg->min_partition_size = cfg->min_partition_size;
  extra_cfg->enable_intra_edge_filter = (cfg->disable_intra_edge_filter == 0);
  extra_cfg->enable_tx64 = (cfg->disable_tx_64x64 == 0);
  extra_cfg->enable_flip_idtx = (cfg->disable_flip_idtx == 0);
  extra_cfg->enable_masked_comp = (cfg->disable_masked_comp == 0);
  extra_cfg->enable_interintra_comp = (cfg->disable_inter_intra_comp == 0);
  extra_cfg->enable_smooth_interintra = (cfg->disable_smooth_inter_intra == 0);
  extra_cfg->enable_interinter_wedge = (cfg->disable_inter_inter_wedge == 0);
  extra_cfg->enable_interintra_wedge = (cfg->disable_inter_intra_wedge == 0);
  extra_cfg->enable_global_motion = (cfg->disable_global_motion == 0);
  extra_cfg->enable_filter_intra = (cfg->disable_filter_intra == 0);
  extra_cfg->enable_smooth_intra = (cfg->disable_smooth_intra == 0);
  extra_cfg->enable_paeth_intra = (cfg->disable_paeth_intra == 0);
  extra_cfg->enable_cfl_intra = (cfg->disable_cfl == 0);
  extra_cfg->enable_obmc = (cfg->disable_obmc == 0);
  extra_cfg->enable_palette = (cfg->disable_palette == 0);
  extra_cfg->enable_intrabc = (cfg->disable_intrabc == 0);
  extra_cfg->disable_trellis_quant = cfg->disable_trellis_quant;
  extra_cfg->allow_ref_frame_mvs = (cfg->disable_ref_frame_mv == 0);
  extra_cfg->enable_ref_frame_mvs = (cfg->disable_ref_frame_mv == 0);
  extra_cfg->enable_onesided_comp = (cfg->disable_one_sided_comp == 0);
  extra_cfg->enable_reduced_reference_set = cfg->reduced_reference_set;
  extra_cfg->reduced_tx_type_set = cfg->reduced_tx_type_set;
}